

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

bool __thiscall QStyleSheetBorderData::isOpaque(QStyleSheetBorderData *this)

{
  BorderStyle BVar1;
  char cVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0;
  bVar4 = false;
  while (((BVar1 = this->styles[uVar3], BVar1 == BorderStyle_None || (BVar1 == BorderStyle_Native))
         || (((BVar1 == BorderStyle_Solid || BVar1 - BorderStyle_Groove < 0xfffffffa &&
              (cVar2 = QBrush::isOpaque(), cVar2 != '\0')) &&
             ((this->radii[uVar3].wd.m_i < 1 || (this->radii[uVar3].ht.m_i < 1))))))) {
    bVar4 = 2 < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 4) {
LAB_003702dd:
      if (((this->bi).d.ptr == (QStyleSheetBorderImageData *)0x0) ||
         (cVar2 = QPixmap::hasAlpha(), cVar2 == '\0')) {
        bVar4 = true;
      }
      else {
LAB_003702f3:
        bVar4 = false;
      }
      return bVar4;
    }
  }
  if (!bVar4) goto LAB_003702f3;
  goto LAB_003702dd;
}

Assistant:

bool isOpaque() const
    {
        for (int i = 0; i < 4; i++) {
            if (styles[i] == QCss::BorderStyle_Native || styles[i] == QCss::BorderStyle_None)
                continue;
            if (styles[i] >= QCss::BorderStyle_Dotted && styles[i] <= QCss::BorderStyle_DotDotDash
                && styles[i] != BorderStyle_Solid)
                return false;
            if (!colors[i].isOpaque())
                return false;
            if (!radii[i].isEmpty())
                return false;
        }
        if (bi != nullptr && bi->pixmap.hasAlpha())
            return false;
        return true;
    }